

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::internalRedo(QWidgetLineControl *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  QWidgetLineControl *in_RDI;
  long in_FS_OFFSET;
  Command *next;
  Command *cmd;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = isRedoAvailable(in_RDI);
  if (bVar3) {
    internalDeselect((QWidgetLineControl *)in_RDI);
    while( true ) {
      iVar7 = in_RDI->m_undoState;
      sVar4 = std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
              ::size(&in_RDI->m_history);
      if ((int)sVar4 <= iVar7) break;
      in_RDI->m_undoState = in_RDI->m_undoState + 1;
      pvVar5 = std::
               vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>::
               operator[]((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                           *)in_RDI,CONCAT44(iVar7,in_stack_ffffffffffffffc8));
      switch(*(byte *)pvVar5 & 0xf) {
      case 0:
        in_RDI->m_selstart = pvVar5->selStart;
        in_RDI->m_selend = pvVar5->selEnd;
        in_RDI->m_cursor = pvVar5->pos;
        break;
      case 1:
        QString::insert((longlong)&in_RDI->m_text,(QChar *)(long)pvVar5->pos);
        in_RDI->m_cursor = pvVar5->pos + 1;
        break;
      case 2:
      case 3:
      case 4:
      case 5:
        QString::remove((longlong)&in_RDI->m_text,(long)pvVar5->pos);
        in_RDI->m_selstart = pvVar5->selStart;
        in_RDI->m_selend = pvVar5->selEnd;
        in_RDI->m_cursor = pvVar5->pos;
        break;
      case 6:
        in_RDI->m_selstart = pvVar5->selStart;
        in_RDI->m_selend = pvVar5->selEnd;
        in_RDI->m_cursor = pvVar5->pos;
      }
      iVar1 = in_RDI->m_undoState;
      sVar4 = std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
              ::size(&in_RDI->m_history);
      if ((((iVar1 < (int)sVar4) &&
           (pvVar6 = std::
                     vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                     ::operator[]((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                                   *)in_RDI,CONCAT44(iVar7,in_stack_ffffffffffffffc8)),
           (*(byte *)pvVar6 & 0xf) != (*(byte *)pvVar5 & 0xf))) && ((*(byte *)pvVar5 & 0xf) < 4)) &&
         (((undefined1  [16])((undefined1  [16])*pvVar6 & (undefined1  [16])0xf) !=
           (undefined1  [16])0x0 &&
          (((*(byte *)pvVar6 & 0xf) < 4 ||
           ((undefined1  [16])((undefined1  [16])*pvVar5 & (undefined1  [16])0xf) ==
            (undefined1  [16])0x0)))))) break;
    }
    *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xffbf | 0x40;
    emitCursorPositionChanged((QWidgetLineControl *)CONCAT44(iVar7,in_stack_ffffffffffffffc8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::internalRedo()
{
    if (!isRedoAvailable())
        return;
    internalDeselect();
    while (m_undoState < (int)m_history.size()) {
        Command& cmd = m_history[m_undoState++];
        switch (cmd.type) {
        case Insert:
            m_text.insert(cmd.pos, cmd.uc);
            m_cursor = cmd.pos + 1;
            break;
        case SetSelection:
            m_selstart = cmd.selStart;
            m_selend = cmd.selEnd;
            m_cursor = cmd.pos;
            break;
        case Remove:
        case Delete:
        case RemoveSelection:
        case DeleteSelection:
            m_text.remove(cmd.pos, 1);
            m_selstart = cmd.selStart;
            m_selend = cmd.selEnd;
            m_cursor = cmd.pos;
            break;
        case Separator:
            m_selstart = cmd.selStart;
            m_selend = cmd.selEnd;
            m_cursor = cmd.pos;
            break;
        }
        if (m_undoState < (int)m_history.size()) {
            Command& next = m_history[m_undoState];
            if (next.type != cmd.type && cmd.type < RemoveSelection && next.type != Separator
                 && (next.type < RemoveSelection || cmd.type == Separator))
                break;
        }
    }
    m_textDirty = true;
    emitCursorPositionChanged();
}